

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O3

void mbedtls_arc4_setup(mbedtls_arc4_context *ctx,uchar *key,uint keylen)

{
  uchar *puVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  
  ctx->x = 0;
  ctx->y = 0;
  uVar5 = '\0';
  uVar6 = '\x01';
  uVar7 = '\x02';
  uVar8 = '\x03';
  uVar9 = '\x04';
  uVar10 = '\x05';
  uVar11 = '\x06';
  uVar12 = '\a';
  uVar13 = '\b';
  uVar14 = '\t';
  uVar15 = '\n';
  uVar16 = '\v';
  uVar17 = '\f';
  uVar18 = '\r';
  uVar19 = '\x0e';
  uVar20 = '\x0f';
  lVar2 = 0;
  do {
    puVar1 = ctx->m + lVar2;
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    puVar1[2] = uVar7;
    puVar1[3] = uVar8;
    puVar1[4] = uVar9;
    puVar1[5] = uVar10;
    puVar1[6] = uVar11;
    puVar1[7] = uVar12;
    puVar1[8] = uVar13;
    puVar1[9] = uVar14;
    puVar1[10] = uVar15;
    puVar1[0xb] = uVar16;
    puVar1[0xc] = uVar17;
    puVar1[0xd] = uVar18;
    puVar1[0xe] = uVar19;
    puVar1[0xf] = uVar20;
    lVar2 = lVar2 + 0x10;
    uVar5 = uVar5 + '\x10';
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
  } while (lVar2 != 0x100);
  lVar2 = 0;
  uVar3 = 0;
  bVar4 = 0;
  do {
    if (keylen <= uVar3) {
      uVar3 = 0;
    }
    uVar5 = ctx->m[lVar2];
    bVar4 = bVar4 + uVar5 + key[uVar3];
    ctx->m[lVar2] = ctx->m[bVar4];
    ctx->m[bVar4] = uVar5;
    lVar2 = lVar2 + 1;
    uVar3 = uVar3 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void mbedtls_arc4_setup( mbedtls_arc4_context *ctx, const unsigned char *key,
                 unsigned int keylen )
{
    int i, j, a;
    unsigned int k;
    unsigned char *m;

    ctx->x = 0;
    ctx->y = 0;
    m = ctx->m;

    for( i = 0; i < 256; i++ )
        m[i] = (unsigned char) i;

    j = k = 0;

    for( i = 0; i < 256; i++, k++ )
    {
        if( k >= keylen ) k = 0;

        a = m[i];
        j = ( j + a + key[k] ) & 0xFF;
        m[i] = m[j];
        m[j] = (unsigned char) a;
    }
}